

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  Message *pMVar1;
  uint32 *puVar2;
  Type TVar3;
  char *pcVar4;
  int in_EDX;
  uint uVar5;
  
  pMVar1 = this->default_instance_;
  puVar2 = this->offsets_;
  pcVar4 = FieldDescriptor::index(field,(char *)field,in_EDX);
  uVar5 = puVar2[(int)pcVar4];
  TVar3 = FieldDescriptor::type(field);
  if ((TVar3 == TYPE_BYTES) || (TVar3 == TYPE_STRING)) {
    uVar5 = uVar5 & 0xfffffffe;
  }
  return (void *)((long)&(pMVar1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
}

Assistant:

const void* GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8*>(default_instance_) +
           OffsetValue(offsets_[field->index()], field->type());
  }